

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall ON_RTree::Remove(ON_RTree *this,double *a_min,double *a_max,void *a_dataId)

{
  bool bVar1;
  ON_RTreeBBox rect;
  ON_RTreeBBox local_38;
  
  if (this->m_root == (ON_RTreeNode *)0x0) {
    bVar1 = false;
  }
  else {
    local_38.m_min[2] = a_min[2];
    local_38.m_min[0] = *a_min;
    local_38.m_min[1] = a_min[1];
    local_38.m_max[0] = *a_max;
    local_38.m_max[1] = a_max[1];
    local_38.m_max[2] = a_max[2];
    if (((local_38.m_max[0] < local_38.m_min[0]) || (local_38.m_max[1] < local_38.m_min[1])) ||
       (local_38.m_max[2] < local_38.m_min[2])) {
      bVar1 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
                 ,0x420,"","ON_RTree::Remove - invalid a_min[] or a_max[] input.");
    }
    else {
      bVar1 = RemoveRect(this,&local_38,(ON__INT_PTR)a_dataId,&this->m_root);
      bVar1 = !bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool ON_RTree::Remove(const double a_min[ON_RTree_NODE_DIM], const double a_max[ON_RTree_NODE_DIM], void* a_dataId)
{
  bool rc = false;
  if ( 0 != m_root )
  {
    ON_RTreeBBox rect;
    memcpy(rect.m_min,a_min,sizeof(rect.m_min));
    memcpy(rect.m_max,a_max,sizeof(rect.m_max));
    if ( rect.m_min[0] <= rect.m_max[0] && rect.m_min[1] <= rect.m_max[1] && rect.m_min[2] <= rect.m_max[2] )
    {  
      // RemoveRect() returns 0 on success
      // The ON__INT_PTR cast is save because ON__INT_PTR == sizeof(void*)
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_PUSH
// Disable warning C4311: 'type cast' : pointer truncation from 'void *' to 'ON__INT_PTR'
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4311 )
#endif
      rc = (0 ==  RemoveRect(&rect, (ON__INT_PTR)a_dataId, &m_root));
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_POP
#endif

    }
    else
    {
      // invalid bounding box - don't let this corrupt the tree
      ON_ERROR("ON_RTree::Remove - invalid a_min[] or a_max[] input.");
    }
  }
  return rc;
}